

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Point3f pbrt::SampleSphericalRectangle
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point2f u,Float *pdf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar23;
  undefined1 auVar24 [16];
  int iVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar48;
  undefined8 in_XMM0_Qb;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar49;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar50;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  float fVar59;
  float fVar60;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar61;
  undefined1 auVar58 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  undefined1 auVar67 [16];
  float error;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  Point3f PVar81;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1a8 [16];
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_128 [16];
  float local_118;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  uint local_78;
  float local_68;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  local_118 = u.super_Tuple2<pbrt::Point2,_float>.x;
  fVar32 = (ex->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar1 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar8 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar51._0_4_ = (float)uVar1 * (float)uVar1;
  auVar51._4_4_ = (float)uVar8 * (float)uVar8;
  auVar51._8_8_ = 0;
  auVar29 = vmovshdup_avx(auVar51);
  fVar32 = fVar32 * fVar32 + auVar51._0_4_ + auVar29._0_4_;
  if (fVar32 < 0.0) {
    fVar32 = sqrtf(fVar32);
  }
  else {
    auVar29 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
    fVar32 = auVar29._0_4_;
  }
  fVar62 = (ey->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar2 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar9 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar52._0_4_ = (float)uVar2 * (float)uVar2;
  auVar52._4_4_ = (float)uVar9 * (float)uVar9;
  auVar52._8_8_ = 0;
  auVar29 = vmovshdup_avx(auVar52);
  fVar62 = fVar62 * fVar62 + auVar52._0_4_ + auVar29._0_4_;
  if (fVar62 < 0.0) {
    fVar62 = sqrtf(fVar62);
  }
  else {
    auVar29 = vsqrtss_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
    fVar62 = auVar29._0_4_;
  }
  uVar3 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar10 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar53._4_4_ = uVar10;
  auVar53._0_4_ = uVar3;
  auVar53._8_8_ = 0;
  auVar63._4_4_ = fVar32;
  auVar63._0_4_ = fVar32;
  auVar63._8_4_ = fVar32;
  auVar63._12_4_ = fVar32;
  auVar51 = vdivps_avx(auVar53,auVar63);
  uVar4 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar11 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar54._4_4_ = uVar11;
  auVar54._0_4_ = uVar4;
  auVar54._8_8_ = 0;
  auVar29._4_4_ = fVar62;
  auVar29._0_4_ = fVar62;
  auVar29._8_4_ = fVar62;
  auVar29._12_4_ = fVar62;
  auVar52 = vdivps_avx(auVar54,auVar29);
  fVar62 = (s->super_Tuple3<pbrt::Point3,_float>).x - (pRef->super_Tuple3<pbrt::Point3,_float>).x;
  fVar69 = (s->super_Tuple3<pbrt::Point3,_float>).y - (pRef->super_Tuple3<pbrt::Point3,_float>).y;
  fVar30 = (s->super_Tuple3<pbrt::Point3,_float>).z - (pRef->super_Tuple3<pbrt::Point3,_float>).z;
  auVar53 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x),0x10);
  auVar29 = vblendps_avx(auVar29,auVar63,2);
  auVar53 = vdivps_avx(auVar53,auVar29);
  auVar63 = vmovshdup_avx(auVar53);
  auVar54 = vinsertps_avx(auVar53,auVar51,0x4c);
  auVar27._0_4_ = auVar54._0_4_ * auVar52._0_4_;
  auVar27._4_4_ = auVar54._4_4_ * auVar52._4_4_;
  auVar27._8_4_ = auVar54._8_4_ * auVar52._8_4_;
  auVar27._12_4_ = auVar54._12_4_ * auVar52._12_4_;
  auVar26 = vpermi2ps_avx512vl(_DAT_00565630,auVar53,auVar52);
  auVar26 = vfmsub213ps_fma(auVar26,auVar51,auVar27);
  auVar54 = vfnmadd213ps_fma(auVar54,auVar52,auVar27);
  auVar74._0_4_ = auVar26._0_4_ + auVar54._0_4_;
  auVar74._4_4_ = auVar26._4_4_ + auVar54._4_4_;
  auVar74._8_4_ = auVar26._8_4_ + auVar54._8_4_;
  auVar74._12_4_ = auVar26._12_4_ + auVar54._12_4_;
  auVar26 = ZEXT416((uint)(auVar51._0_4_ * auVar53._0_4_));
  auVar54 = vfmsub213ss_fma(auVar52,auVar63,auVar26);
  auVar26 = vfnmadd231ss_fma(auVar26,auVar51,auVar53);
  fVar32 = auVar54._0_4_ + auVar26._0_4_;
  auVar54 = vinsertps_avx(auVar52,auVar51,0x1c);
  auVar26._0_4_ = auVar54._0_4_ * fVar69;
  auVar26._4_4_ = auVar54._4_4_ * fVar69;
  auVar26._8_4_ = auVar54._8_4_ * fVar69;
  auVar26._12_4_ = auVar54._12_4_ * fVar69;
  auVar71._4_4_ = fVar62;
  auVar71._0_4_ = fVar62;
  auVar71._8_4_ = fVar62;
  auVar71._12_4_ = fVar62;
  auVar26 = vfmadd213ps_fma(auVar71,auVar53,auVar26);
  auVar64._4_4_ = fVar30;
  auVar64._0_4_ = fVar30;
  auVar64._8_4_ = fVar30;
  auVar64._12_4_ = fVar30;
  auVar54 = vinsertps_avx(auVar51,auVar52,0x4c);
  auVar64 = vfmadd213ps_fma(auVar54,auVar64,auVar26);
  auVar54 = vmovshdup_avx(auVar64);
  auVar26 = vmovshdup_avx(auVar74);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * fVar69)),auVar74,ZEXT416((uint)fVar62));
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar32),ZEXT416((uint)fVar30));
  auVar55._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
  auVar55._8_4_ = auVar26._8_4_ ^ 0x80000000;
  auVar55._12_4_ = auVar26._12_4_ ^ 0x80000000;
  if (-auVar26._0_4_ < auVar26._0_4_) {
    uVar23 = CONCAT44(auVar74._4_4_,auVar74._0_4_);
    auVar74._0_8_ = uVar23 ^ 0x8000000080000000;
    auVar74._8_4_ = -auVar74._8_4_;
    auVar74._12_4_ = -auVar74._12_4_;
  }
  auVar27 = vminss_avx(auVar55,auVar26);
  auVar56._0_4_ = auVar27._0_4_;
  auVar77._4_4_ = auVar56._0_4_;
  auVar77._0_4_ = auVar56._0_4_;
  auVar77._8_4_ = auVar56._0_4_;
  auVar77._12_4_ = auVar56._0_4_;
  fVar68 = auVar64._0_4_;
  auVar80._0_8_ = CONCAT44(auVar64._4_4_ * auVar56._0_4_,fVar68 * auVar56._0_4_);
  auVar80._8_4_ = auVar64._8_4_ * auVar56._0_4_;
  auVar80._12_4_ = auVar64._12_4_ * auVar56._0_4_;
  auVar56._4_12_ = auVar64._4_12_;
  auVar78._0_4_ = fVar68 + auVar29._0_4_;
  auVar78._4_4_ = auVar64._4_4_ + auVar29._4_4_;
  auVar78._8_4_ = auVar64._8_4_ + auVar29._8_4_;
  auVar78._12_4_ = auVar64._12_4_ + auVar29._12_4_;
  auVar16 = vmovshdup_avx(auVar78);
  fVar69 = fVar68 * auVar16._0_4_;
  auVar29 = vfmsub213ss_fma(auVar64,auVar54,ZEXT416((uint)fVar69));
  auVar65 = vfnmadd213ss_fma(auVar16,auVar64,ZEXT416((uint)fVar69));
  fVar62 = auVar29._0_4_ + auVar65._0_4_;
  auVar70._0_4_ = auVar78._0_4_ * auVar56._0_4_;
  auVar70._4_4_ = auVar78._4_4_ * auVar56._0_4_;
  auVar70._8_4_ = auVar78._8_4_ * auVar56._0_4_;
  auVar70._12_4_ = auVar78._12_4_ * auVar56._0_4_;
  auVar29 = vblendps_avx(auVar64,auVar78,2);
  auVar71 = vfmsub213ps_fma(auVar77,auVar29,auVar70);
  auVar75._4_12_ = auVar78._4_12_;
  auVar75._0_4_ = auVar56._0_4_;
  auVar27 = vblendps_avx(auVar78,auVar77,2);
  auVar33 = vfnmadd213ps_fma(auVar27,auVar75,auVar70);
  local_1d8._0_4_ = auVar71._0_4_ + auVar33._0_4_;
  local_1d8._4_4_ = auVar71._4_4_ + auVar33._4_4_;
  fStack_1d0 = auVar71._8_4_ + auVar33._8_4_;
  fStack_1cc = auVar71._12_4_ + auVar33._12_4_;
  auVar71 = vfmsub231ss_fma(ZEXT416((uint)fVar69),auVar16,auVar78);
  auVar72._0_4_ = (float)local_1d8._0_4_ * (float)local_1d8._0_4_;
  auVar72._4_4_ = (float)local_1d8._4_4_ * (float)local_1d8._4_4_;
  auVar72._8_4_ = fStack_1d0 * fStack_1d0;
  auVar72._12_4_ = fStack_1cc * fStack_1cc;
  auVar27 = vhaddps_avx(auVar72,auVar72);
  fVar69 = auVar71._0_4_ + auVar65._0_4_;
  fVar30 = fVar69 * fVar69 + auVar27._0_4_;
  auVar27 = vblendps_avx(auVar78,auVar64,2);
  auVar71 = vfmsub231ps_fma(auVar70,auVar27,auVar77);
  local_1f8._0_4_ = auVar71._0_4_ + auVar33._0_4_;
  local_1f8._4_4_ = auVar71._4_4_ + auVar33._4_4_;
  fStack_1f0 = auVar71._8_4_ + auVar33._8_4_;
  fStack_1ec = auVar71._12_4_ + auVar33._12_4_;
  fVar61 = auVar54._0_4_ * auVar78._0_4_;
  auVar71 = vfmsub213ss_fma(auVar78,auVar16,ZEXT416((uint)fVar61));
  auVar70 = vfnmadd213ss_fma(auVar54,auVar78,ZEXT416((uint)fVar61));
  fVar59 = auVar70._0_4_ + auVar71._0_4_;
  auVar65._0_4_ = (float)local_1f8._0_4_ * (float)local_1f8._0_4_;
  auVar65._4_4_ = (float)local_1f8._4_4_ * (float)local_1f8._4_4_;
  auVar65._8_4_ = fStack_1f0 * fStack_1f0;
  auVar65._12_4_ = fStack_1ec * fStack_1ec;
  auVar71 = vhaddps_avx(auVar65,auVar65);
  auVar33 = vfmsub213ps_fma(auVar29,auVar77,auVar80);
  auVar29 = vblendps_avx(auVar64,auVar77,2);
  auVar65 = vfnmadd213ps_fma(auVar29,auVar56,auVar80);
  local_c8._0_4_ = auVar33._0_4_ + auVar65._0_4_;
  local_c8._4_4_ = auVar33._4_4_ + auVar65._4_4_;
  fStack_c0 = auVar33._8_4_ + auVar65._8_4_;
  fStack_bc = auVar33._12_4_ + auVar65._12_4_;
  auVar33._0_4_ = (float)local_c8._0_4_ * (float)local_c8._0_4_;
  auVar33._4_4_ = (float)local_c8._4_4_ * (float)local_c8._4_4_;
  auVar33._8_4_ = fStack_c0 * fStack_c0;
  auVar33._12_4_ = fStack_bc * fStack_bc;
  auVar29 = vhaddps_avx(auVar33,auVar33);
  fVar60 = fVar62 * fVar62 + auVar29._0_4_;
  if (fVar60 < 0.0) {
    fVar60 = sqrtf(fVar60);
  }
  else {
    auVar29 = vsqrtss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
    fVar60 = auVar29._0_4_;
  }
  local_1a8._0_8_ = (ulong)(uint)-fVar61 ^ 0x8000000000000000;
  local_1a8._8_4_ = 0x80000000;
  local_1a8._12_4_ = 0x80000000;
  fVar61 = fVar59 * fVar59 + auVar71._0_4_;
  if (fVar30 < 0.0) {
    fVar30 = sqrtf(fVar30);
  }
  else {
    auVar29 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
    fVar30 = auVar29._0_4_;
  }
  auVar66._4_4_ = fVar60;
  auVar66._0_4_ = fVar60;
  auVar66._8_4_ = fVar60;
  auVar66._12_4_ = fVar60;
  auVar76._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
  auVar76._8_4_ = -auVar80._8_4_;
  auVar76._12_4_ = -auVar80._12_4_;
  auVar73._4_4_ = fVar30;
  auVar73._0_4_ = fVar30;
  auVar73._8_4_ = fVar30;
  auVar73._12_4_ = fVar30;
  if (fVar61 < 0.0) {
    fVar61 = sqrtf(fVar61);
  }
  else {
    auVar29 = vsqrtss_avx(ZEXT416((uint)fVar61),ZEXT416((uint)fVar61));
    fVar61 = auVar29._0_4_;
  }
  auVar29 = vdivps_avx(_local_c8,auVar66);
  fVar62 = fVar62 / fVar60;
  auVar71 = vdivps_avx(_local_1d8,auVar73);
  fVar69 = fVar69 / fVar30;
  auVar79._4_4_ = fVar61;
  auVar79._0_4_ = fVar61;
  auVar79._8_4_ = fVar61;
  auVar79._12_4_ = fVar61;
  auVar27 = vfmadd132ps_fma(auVar27,auVar76,auVar77);
  local_1e8._0_4_ = auVar27._0_4_ + auVar65._0_4_;
  local_1e8._4_4_ = auVar27._4_4_ + auVar65._4_4_;
  fStack_1e0 = auVar27._8_4_ + auVar65._8_4_;
  fStack_1dc = auVar27._12_4_ + auVar65._12_4_;
  auVar34._0_4_ = (float)local_1e8._0_4_ * (float)local_1e8._0_4_;
  auVar34._4_4_ = (float)local_1e8._4_4_ * (float)local_1e8._4_4_;
  auVar34._8_4_ = fStack_1e0 * fStack_1e0;
  auVar34._12_4_ = fStack_1dc * fStack_1dc;
  auVar27 = vhaddps_avx(auVar34,auVar34);
  auVar33 = vfmadd231ss_fma(local_1a8,auVar54,ZEXT416((uint)fVar68));
  fVar30 = auVar33._0_4_ + auVar70._0_4_;
  fVar60 = fVar30 * fVar30 + auVar27._0_4_;
  if (fVar60 < 0.0) {
    local_158._4_4_ = sqrtf(fVar60);
  }
  else {
    auVar27 = vsqrtss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
    local_158._4_4_ = auVar27._0_4_;
  }
  auVar27 = vdivps_avx(_local_1f8,auVar79);
  auVar35._0_4_ = fVar59 / fVar61;
  auVar35._4_12_ = SUB6012((undefined1  [60])0x0,0);
  local_158._0_4_ = local_158._4_4_;
  fStack_150 = (float)local_158._4_4_;
  fStack_14c = (float)local_158._4_4_;
  auVar33 = vmovshdup_avx(auVar29);
  auVar65 = vmovshdup_avx(auVar71);
  auVar70 = vfnmsub231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar33._0_4_)),auVar29,auVar71);
  auVar70 = vfnmadd231ss_fma(auVar70,ZEXT416((uint)fVar62),ZEXT416((uint)fVar69));
  if (0.0 <= auVar70._0_4_) {
    fVar59 = auVar71._0_4_ + auVar29._0_4_;
    fVar60 = auVar71._4_4_ + auVar29._4_4_;
    fVar61 = auVar71._8_4_ + auVar29._8_4_;
    fVar31 = auVar71._12_4_ + auVar29._12_4_;
    auVar37._0_4_ = fVar59 * fVar59;
    auVar37._4_4_ = fVar60 * fVar60;
    auVar37._8_4_ = fVar61 * fVar61;
    auVar37._12_4_ = fVar31 * fVar31;
    auVar70 = vhaddps_avx(auVar37,auVar37);
    fVar59 = (fVar62 + fVar69) * (fVar62 + fVar69) + auVar70._0_4_;
    if (fVar59 < 0.0) {
      fVar59 = sqrtf(fVar59);
    }
    else {
      auVar70 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
      fVar59 = auVar70._0_4_;
    }
    auVar70 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar59 * 0.5)));
    uVar17 = vcmpss_avx512f(ZEXT416((uint)(fVar59 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar19 = (bool)((byte)uVar17 & 1);
    fVar59 = asinf((float)((uint)bVar19 * -0x40800000 + (uint)!bVar19 * auVar70._0_4_));
    fVar59 = fVar59 + fVar59;
  }
  else {
    auVar70 = vsubps_avx(auVar71,auVar29);
    auVar36._0_4_ = auVar70._0_4_ * auVar70._0_4_;
    auVar36._4_4_ = auVar70._4_4_ * auVar70._4_4_;
    auVar36._8_4_ = auVar70._8_4_ * auVar70._8_4_;
    auVar36._12_4_ = auVar70._12_4_ * auVar70._12_4_;
    auVar70 = vhaddps_avx(auVar36,auVar36);
    fVar59 = (fVar69 - fVar62) * (fVar69 - fVar62) + auVar70._0_4_;
    if (fVar59 < 0.0) {
      fVar59 = sqrtf(fVar59);
    }
    else {
      auVar70 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
      fVar59 = auVar70._0_4_;
    }
    auVar70 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar59 * 0.5)));
    uVar17 = vcmpss_avx512f(ZEXT416((uint)(fVar59 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar19 = (bool)((byte)uVar17 & 1);
    auVar43._0_4_ = asinf((float)((uint)bVar19 * -0x40800000 + (uint)!bVar19 * auVar70._0_4_));
    auVar43._4_60_ = extraout_var;
    auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar43._0_16_,ZEXT416(0x40490fdb));
    fVar59 = auVar70._0_4_;
  }
  auVar70 = vdivps_avx(_local_1e8,_local_158);
  fVar30 = fVar30 / (float)local_158._4_4_;
  auVar72 = vmovshdup_avx(auVar27);
  fVar61 = auVar72._0_4_;
  auVar65 = vfnmsub231ss_fma(ZEXT416((uint)(fVar61 * auVar65._0_4_)),auVar27,auVar71);
  auVar65 = vfnmadd231ss_fma(auVar65,ZEXT416((uint)fVar69),auVar35);
  fVar60 = auVar27._0_4_;
  if (0.0 <= auVar65._0_4_) {
    fVar31 = fVar60 + auVar71._0_4_;
    fVar48 = auVar27._4_4_ + auVar71._4_4_;
    fVar50 = auVar27._8_4_ + auVar71._8_4_;
    fVar49 = auVar27._12_4_ + auVar71._12_4_;
    auVar39._0_4_ = fVar31 * fVar31;
    auVar39._4_4_ = fVar48 * fVar48;
    auVar39._8_4_ = fVar50 * fVar50;
    auVar39._12_4_ = fVar49 * fVar49;
    auVar71 = vhaddps_avx(auVar39,auVar39);
    fVar69 = (fVar69 + auVar35._0_4_) * (fVar69 + auVar35._0_4_) + auVar71._0_4_;
    if (fVar69 < 0.0) {
      fVar69 = sqrtf(fVar69);
    }
    else {
      auVar71 = vsqrtss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
      fVar69 = auVar71._0_4_;
    }
    auVar71 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar69 * 0.5)));
    uVar17 = vcmpss_avx512f(ZEXT416((uint)(fVar69 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar19 = (bool)((byte)uVar17 & 1);
    fVar69 = asinf((float)((uint)bVar19 * -0x40800000 + (uint)!bVar19 * auVar71._0_4_));
    fVar69 = fVar69 + fVar69;
  }
  else {
    auVar71 = vsubps_avx(auVar27,auVar71);
    auVar38._0_4_ = auVar71._0_4_ * auVar71._0_4_;
    auVar38._4_4_ = auVar71._4_4_ * auVar71._4_4_;
    auVar38._8_4_ = auVar71._8_4_ * auVar71._8_4_;
    auVar38._12_4_ = auVar71._12_4_ * auVar71._12_4_;
    auVar71 = vhaddps_avx(auVar38,auVar38);
    fVar69 = (auVar35._0_4_ - fVar69) * (auVar35._0_4_ - fVar69) + auVar71._0_4_;
    if (fVar69 < 0.0) {
      fVar69 = sqrtf(fVar69);
    }
    else {
      auVar71 = vsqrtss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
      fVar69 = auVar71._0_4_;
    }
    auVar71 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar69 * 0.5)));
    uVar17 = vcmpss_avx512f(ZEXT416((uint)(fVar69 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar19 = (bool)((byte)uVar17 & 1);
    auVar44._0_4_ = asinf((float)((uint)bVar19 * -0x40800000 + (uint)!bVar19 * auVar71._0_4_));
    auVar44._4_60_ = extraout_var_00;
    auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar44._0_16_,ZEXT416(0x40490fdb));
    fVar69 = auVar71._0_4_;
  }
  auVar71 = vmovshdup_avx(auVar70);
  fVar48 = auVar71._0_4_;
  auVar27 = vfnmsub231ss_fma(ZEXT416((uint)(fVar48 * fVar61)),auVar70,auVar27);
  auVar27 = vfnmadd231ss_fma(auVar27,auVar35,ZEXT416((uint)fVar30));
  fVar31 = auVar70._0_4_;
  if (0.0 <= auVar27._0_4_) {
    fVar60 = (auVar35._0_4_ + fVar30) * (auVar35._0_4_ + fVar30) +
             (fVar60 + fVar31) * (fVar60 + fVar31) + (fVar61 + fVar48) * (fVar61 + fVar48);
    if (fVar60 < 0.0) {
      fVar60 = sqrtf(fVar60);
    }
    else {
      auVar27 = vsqrtss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
      fVar60 = auVar27._0_4_;
    }
    auVar27 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar60 * 0.5)));
    uVar17 = vcmpss_avx512f(ZEXT416((uint)(fVar60 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar19 = (bool)((byte)uVar17 & 1);
    fVar60 = asinf((float)((uint)bVar19 * -0x40800000 + (uint)!bVar19 * auVar27._0_4_));
    fVar60 = fVar60 + fVar60;
  }
  else {
    fVar60 = (fVar30 - auVar35._0_4_) * (fVar30 - auVar35._0_4_) +
             (fVar31 - fVar60) * (fVar31 - fVar60) + (fVar48 - fVar61) * (fVar48 - fVar61);
    if (fVar60 < 0.0) {
      fVar60 = sqrtf(fVar60);
    }
    else {
      auVar27 = vsqrtss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
      fVar60 = auVar27._0_4_;
    }
    auVar27 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar60 * 0.5)));
    uVar17 = vcmpss_avx512f(ZEXT416((uint)(fVar60 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar19 = (bool)((byte)uVar17 & 1);
    auVar45._0_4_ = asinf((float)((uint)bVar19 * -0x40800000 + (uint)!bVar19 * auVar27._0_4_));
    auVar45._4_60_ = extraout_var_01;
    auVar27 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar45._0_16_,ZEXT416(0x40490fdb));
    fVar60 = auVar27._0_4_;
  }
  auVar27 = vfnmsub231ss_fma(ZEXT416((uint)(fVar48 * auVar33._0_4_)),auVar70,auVar29);
  auVar27 = vfnmadd231ss_fma(auVar27,ZEXT416((uint)fVar30),ZEXT416((uint)fVar62));
  if (0.0 <= auVar27._0_4_) {
    fVar31 = auVar29._0_4_ + fVar31;
    fVar61 = auVar29._4_4_ + auVar70._4_4_;
    fVar48 = auVar29._8_4_ + auVar70._8_4_;
    fVar50 = auVar29._12_4_ + auVar70._12_4_;
    auVar41._0_4_ = fVar31 * fVar31;
    auVar41._4_4_ = fVar61 * fVar61;
    auVar41._8_4_ = fVar48 * fVar48;
    auVar41._12_4_ = fVar50 * fVar50;
    auVar29 = vhaddps_avx(auVar41,auVar41);
    fVar30 = (fVar62 + fVar30) * (fVar62 + fVar30) + auVar29._0_4_;
    if (fVar30 < 0.0) {
      fVar30 = sqrtf(fVar30);
    }
    else {
      auVar29 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
      fVar30 = auVar29._0_4_;
    }
    auVar29 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar30 * 0.5)));
    uVar17 = vcmpss_avx512f(ZEXT416((uint)(fVar30 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar19 = (bool)((byte)uVar17 & 1);
    fVar30 = asinf((float)((uint)bVar19 * -0x40800000 + (uint)!bVar19 * auVar29._0_4_));
    fVar30 = fVar30 + fVar30;
  }
  else {
    auVar29 = vsubps_avx(auVar29,auVar70);
    auVar40._0_4_ = auVar29._0_4_ * auVar29._0_4_;
    auVar40._4_4_ = auVar29._4_4_ * auVar29._4_4_;
    auVar40._8_4_ = auVar29._8_4_ * auVar29._8_4_;
    auVar40._12_4_ = auVar29._12_4_ * auVar29._12_4_;
    auVar29 = vhaddps_avx(auVar40,auVar40);
    fVar30 = (fVar62 - fVar30) * (fVar62 - fVar30) + auVar29._0_4_;
    if (fVar30 < 0.0) {
      fVar30 = sqrtf(fVar30);
    }
    else {
      auVar29 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
      fVar30 = auVar29._0_4_;
    }
    auVar29 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar30 * 0.5)));
    uVar17 = vcmpss_avx512f(ZEXT416((uint)(fVar30 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar19 = (bool)((byte)uVar17 & 1);
    auVar46._0_4_ = asinf((float)((uint)bVar19 * -0x40800000 + (uint)!bVar19 * auVar29._0_4_));
    auVar46._4_60_ = extraout_var_02;
    auVar29 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar46._0_16_,ZEXT416(0x40490fdb));
    fVar30 = auVar29._0_4_;
  }
  if (SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
      ::reg == '\0') {
    iVar25 = __cxa_guard_acquire(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
                                  ::reg);
    if (iVar25 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
                  ::reg,SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::
                        Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                        Vector3<float>const&,pbrt::Point2<float>,float*)::$_0::__invoke(pbrt::
                        StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
                           ::reg);
    }
  }
  dVar15 = (double)fVar59 + (double)fVar69 + (double)fVar60 + (double)fVar30 + -6.2831854820251465;
  auVar42._0_4_ = (float)dVar15;
  auVar42._4_4_ = (int)((ulong)dVar15 >> 0x20);
  auVar42._8_8_ = 0;
  *(long *)(in_FS_OFFSET + -0xf0) = *(long *)(in_FS_OFFSET + -0xf0) + 1;
  if (auVar42._0_4_ <= 0.0) {
    *(long *)(in_FS_OFFSET + -0xf8) = *(long *)(in_FS_OFFSET + -0xf8) + 1;
    if (pdf != (Float *)0x0) {
      *pdf = 0.0;
    }
  }
  else {
    if (pdf != (Float *)0x0) {
      auVar57._0_4_ = 1.0 / auVar42._0_4_;
      auVar57._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar29 = vmaxss_avx(auVar57,ZEXT816(0) << 0x40);
      *pdf = auVar29._0_4_;
    }
    if (0.001 <= auVar42._0_4_) {
      auVar20._8_4_ = 0x80000000;
      auVar20._0_8_ = 0x8000000080000000;
      auVar20._12_4_ = 0x80000000;
      auVar27 = vxorps_avx512vl(auVar35,auVar20);
      auVar29 = vfmsub132ss_fma(auVar42,ZEXT416((uint)fVar60),ZEXT416((uint)local_118));
      fVar30 = auVar29._0_4_ - fVar30;
      auVar47._0_4_ = cosf(fVar30);
      auVar47._4_60_ = extraout_var_03;
      local_1f8._0_4_ = auVar27._0_4_;
      auVar29 = vfmadd213ss_fma(auVar47._0_16_,ZEXT416((uint)fVar62),ZEXT416((uint)local_1f8._0_4_))
      ;
      fVar69 = sinf(fVar30);
      fVar69 = auVar29._0_4_ / fVar69;
      fVar62 = fVar62 * fVar62 + fVar69 * fVar69;
      if (fVar62 < 0.0) {
        fVar62 = sqrtf(fVar62);
      }
      else {
        auVar29 = vsqrtss_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
        fVar62 = auVar29._0_4_;
      }
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar27 = vpternlogd_avx512vl(ZEXT416((uint)fVar69),ZEXT416((uint)(1.0 / fVar62)),auVar21,0xd8
                                   );
      auVar29 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar27);
      uVar17 = vcmpss_avx512f(auVar27,SUB6416(ZEXT464(0xbf7fffff),0),1);
      bVar19 = (bool)((byte)uVar17 & 1);
      auVar28._4_12_ = auVar29._4_12_;
      auVar28._0_4_ = (float)((uint)bVar19 * -0x40800001 + (uint)!bVar19 * auVar29._0_4_);
      auVar22._8_4_ = 0x80000000;
      auVar22._0_8_ = 0x8000000080000000;
      auVar22._12_4_ = 0x80000000;
      auVar27 = vxorps_avx512vl(auVar28,auVar22);
      auVar29 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar28._0_4_ * auVar28._0_4_)),ZEXT816(0) << 0x40);
      if (auVar29._0_4_ < 0.0) {
        fVar62 = sqrtf(auVar29._0_4_);
      }
      else {
        auVar29 = vsqrtss_avx(auVar29,auVar29);
        fVar62 = auVar29._0_4_;
      }
      auVar27 = ZEXT416((uint)((auVar27._0_4_ * auVar56._0_4_) / fVar62));
      local_78 = (uint)auVar55._0_8_;
      uVar17 = vcmpss_avx512f(auVar26,ZEXT416(local_78),0xe);
      auVar29 = vminss_avx(auVar16,auVar27);
      uVar18 = vcmpss_avx512f(auVar27,auVar54,1);
      bVar19 = (bool)((byte)uVar18 & 1);
      fVar69 = (float)((uint)bVar19 * (int)auVar54._0_4_ + (uint)!bVar19 * auVar29._0_4_);
      fVar62 = auVar56._0_4_ * auVar56._0_4_ + fVar69 * fVar69;
      if (fVar62 < 0.0) {
        fVar62 = sqrtf(fVar62);
      }
      else {
        auVar29 = vsqrtss_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
        fVar62 = auVar29._0_4_;
      }
      local_128 = ZEXT416((uint)((byte)uVar17 & 1) * (int)-fVar32 +
                          (uint)!(bool)((byte)uVar17 & 1) * (int)fVar32);
      fVar32 = fVar68 * fVar68 + fVar62 * fVar62;
      if (fVar32 < 0.0) {
        fVar32 = sqrtf(fVar32);
      }
      else {
        auVar29 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
        fVar32 = auVar29._0_4_;
      }
      auVar67._0_4_ = fVar68 / fVar32;
      auVar67._4_12_ = auVar64._4_12_;
      fVar32 = auVar78._0_4_ * auVar78._0_4_ + fVar62 * fVar62;
      if (fVar32 < 0.0) {
        fVar32 = sqrtf(fVar32);
        auVar67 = ZEXT416((uint)auVar67._0_4_);
      }
      else {
        auVar29 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
        fVar32 = auVar29._0_4_;
      }
      auVar24._8_8_ = in_XMM0_Qb;
      auVar24._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
      auVar29 = vmovshdup_avx(auVar24);
      auVar29 = vfmadd213ss_fma(ZEXT416((uint)(auVar78._0_4_ / fVar32 - auVar67._0_4_)),auVar29,
                                auVar67);
      fVar32 = auVar29._0_4_;
      if (fVar32 * fVar32 < 0.999999) {
        fVar30 = 1.0 - fVar32 * fVar32;
        if (fVar30 < 0.0) {
          auVar78._0_4_ = sqrtf(fVar30);
        }
        else {
          auVar29 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
          auVar78._0_4_ = auVar29._0_4_;
        }
        auVar78._0_4_ = (fVar32 * fVar62) / auVar78._0_4_;
      }
      local_68 = auVar63._0_4_;
      fStack_44 = auVar51._4_4_;
      fStack_40 = auVar51._8_4_;
      fStack_3c = auVar51._12_4_;
      fVar32 = auVar74._0_4_ * auVar56._0_4_ + fVar69 * local_68 + auVar78._0_4_ * auVar53._0_4_ +
               (pRef->super_Tuple3<pbrt::Point3,_float>).x;
      auVar29 = vpermi2ps_avx512vl(_DAT_005670a0,auVar74,local_128);
      fVar30 = auVar29._0_4_ * auVar56._0_4_ +
               fVar69 * auVar51._0_4_ + auVar78._0_4_ * auVar52._0_4_;
      fVar59 = auVar29._4_4_ * auVar56._0_4_ + fVar69 * fStack_44 + auVar78._0_4_ * auVar52._4_4_;
      fVar60 = auVar29._8_4_ * auVar56._0_4_ + fVar69 * fStack_40 + auVar78._0_4_ * auVar52._8_4_;
      fVar61 = auVar29._12_4_ * auVar56._0_4_ + fVar69 * fStack_3c + auVar78._0_4_ * auVar52._12_4_;
      fVar62 = (pRef->super_Tuple3<pbrt::Point3,_float>).y;
      fVar69 = (pRef->super_Tuple3<pbrt::Point3,_float>).z;
      auVar78._0_4_ = 0.0;
      fVar68 = 0.0;
      goto LAB_00487cb0;
    }
  }
  auVar16._8_8_ = in_XMM0_Qb;
  auVar16._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  auVar29 = vmovshdup_avx(auVar16);
  fVar32 = local_118 * (ex->super_Tuple3<pbrt::Vector3,_float>).x +
           (s->super_Tuple3<pbrt::Point3,_float>).x +
           auVar29._0_4_ * (ey->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar5 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar12 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  uVar6 = (s->super_Tuple3<pbrt::Point3,_float>).y;
  uVar13 = (s->super_Tuple3<pbrt::Point3,_float>).z;
  fVar62 = local_118 * (float)uVar5 + (float)uVar6;
  fVar69 = local_118 * (float)uVar12 + (float)uVar13;
  auVar78._0_4_ = local_118 * 0.0 + 0.0;
  fVar68 = local_118 * 0.0 + 0.0;
  uVar7 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar14 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar30 = auVar29._0_4_ * (float)uVar7;
  fVar59 = auVar29._4_4_ * (float)uVar14;
  fVar60 = auVar29._8_4_ * 0.0;
  fVar61 = auVar29._12_4_ * 0.0;
LAB_00487cb0:
  auVar58._0_4_ = fVar62 + fVar30;
  auVar58._4_4_ = fVar69 + fVar59;
  auVar58._8_4_ = auVar78._0_4_ + fVar60;
  auVar58._12_4_ = fVar68 + fVar61;
  auVar29 = vinsertps_avx(ZEXT416((uint)fVar32),auVar58,0x1c);
  auVar51 = vmovshdup_avx(auVar58);
  PVar81.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar29._0_8_;
  PVar81.super_Tuple3<pbrt::Point3,_float>.z = auVar51._0_4_;
  return (Point3f)PVar81.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f SampleSphericalRectangle(const Point3f &pRef, const Point3f &s,
                                 const Vector3f &ex, const Vector3f &ey, Point2f u,
                                 Float *pdf) {
    // Compute local reference frame and transform rectangle coordinates
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);
    Vector3f dLocal = R.ToLocal(s - pRef);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float x0 = dLocal.x, y0 = dLocal.y;
    Float x1 = x0 + exl, y1 = y0 + eyl;

    // Find plane normals to rectangle edges and compute internal angles
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);
    Vector3f n0 = Normalize(Cross(v00, v10)), n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01)), n3 = Normalize(Cross(v01, v00));
    Float g0 = AngleBetween(-n0, n1), g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3), g3 = AngleBetween(-n3, n0);

    // Compute spherical rectangle solid angle and PDF
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;
    CHECK_RARE(1e-5, solidAngle <= 0);
    if (solidAngle <= 0) {
        if (pdf != nullptr)
            *pdf = 0;
        return Point3f(s + u[0] * ex + u[1] * ey);
    }
    if (pdf != nullptr)
        *pdf = std::max<Float>(0, 1 / solidAngle);
    if (solidAngle < 1e-3)
        return Point3f(s + u[0] * ex + u[1] * ey);

    // Sample _cu_ for spherical rectangle sample
    Float b0 = n0.z, b1 = n2.z;
    // Float au = u[0] * solidAngle + k;   // original
    Float au = u[0] * solidAngle - g2 - g3;
    Float fu = (std::cos(au) * b0 - b1) / std::sin(au);
    Float cu = std::copysign(1 / std::sqrt(Sqr(fu) + Sqr(b0)), fu);
    cu = Clamp(cu, -OneMinusEpsilon, OneMinusEpsilon);  // avoid NaNs

    // Find _xu_ along $x$ edge for spherical rectangle sample
    Float xu = -(cu * z0) / SafeSqrt(1 - Sqr(cu));
    xu = Clamp(xu, x0, x1);

    // Find _xv_ along $y$ edge for spherical rectangle sample
    Float dd = std::sqrt(Sqr(xu) + Sqr(z0));
    Float h0 = y0 / std::sqrt(Sqr(dd) + Sqr(y0));
    Float h1 = y1 / std::sqrt(Sqr(dd) + Sqr(y1));
    Float hv = h0 + u[1] * (h1 - h0), hvsq = Sqr(hv);
    Float yv = (hvsq < 1 - 1e-6f) ? (hv * dd) / std::sqrt(1 - hvsq) : y1;

    // Return spherical triangle sample in original coordinate system
    return pRef + R.FromLocal(Vector3f(xu, yv, z0));
}